

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLStringTokenizer.cpp
# Opt level: O0

XMLCh * __thiscall xercesc_4_0::XMLStringTokenizer::nextToken(XMLStringTokenizer *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLCh *tokStr;
  XMLSize_t endIndex;
  XMLSize_t startIndex;
  bool tokFound;
  XMLStringTokenizer *this_local;
  
  if (this->fOffset < this->fStringLen) {
    bVar1 = false;
    endIndex = this->fOffset;
    for (tokStr = (XMLCh *)this->fOffset; tokStr < (XMLCh *)this->fStringLen;
        tokStr = (XMLCh *)((long)tokStr + 1)) {
      bVar2 = isDelimeter(this,this->fString[(long)tokStr]);
      if (bVar2) {
        if (bVar1) break;
        endIndex = endIndex + 1;
      }
      else {
        bVar1 = true;
      }
    }
    this->fOffset = (XMLSize_t)tokStr;
    if (bVar1) {
      iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                        (this->fMemoryManager,((long)tokStr + (1 - endIndex)) * 2);
      this_local = (XMLStringTokenizer *)CONCAT44(extraout_var,iVar3);
      XMLString::subString
                ((XMLCh *)this_local,this->fString,endIndex,(XMLSize_t)tokStr,this->fMemoryManager);
      BaseRefVectorOf<char16_t>::addElement
                (&this->fTokens->super_BaseRefVectorOf<char16_t>,(char16_t *)this_local);
    }
    else {
      this_local = (XMLStringTokenizer *)0x0;
    }
  }
  else {
    this_local = (XMLStringTokenizer *)0x0;
  }
  return (XMLCh *)this_local;
}

Assistant:

XMLCh* XMLStringTokenizer::nextToken() {

    if (fOffset >= fStringLen) {
        return 0;
    }

    bool tokFound = false;
    XMLSize_t startIndex = fOffset;
    XMLSize_t endIndex = fOffset;

    for (; endIndex < fStringLen; endIndex++) {

        if (isDelimeter(fString[endIndex])) {

			if (tokFound) {
                break;
            }

			startIndex++;
			continue;
        }

        tokFound = true;
    }

    fOffset = endIndex;

    if (tokFound) {

        XMLCh* tokStr = (XMLCh*) fMemoryManager->allocate
        (
            (endIndex - startIndex + 1) * sizeof(XMLCh)
        );//new XMLCh[(endIndex - startIndex) + 1];

        XMLString::subString(tokStr, fString, startIndex, endIndex, fMemoryManager);
        fTokens->addElement(tokStr);

        return tokStr;
	}

    return 0;
}